

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O2

int hpsolb_(integer *n,doublereal *t,integer *iorder,integer *iheap)

{
  double dVar1;
  doublereal dVar2;
  integer iVar3;
  integer iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar8 = *n;
  if (*iheap == 0) {
    for (uVar7 = 2; (long)uVar7 <= (long)(int)uVar8; uVar7 = uVar7 + 1) {
      dVar1 = t[uVar7 - 1];
      iVar3 = iorder[uVar7 - 1];
      uVar11 = uVar7 & 0xffffffff;
      while (1 < (uint)uVar11) {
        uVar12 = (ulong)((uint)uVar11 >> 1);
        if (t[uVar12 - 1] <= dVar1) break;
        t[uVar11 - 1] = t[uVar12 - 1];
        iorder[uVar11 - 1] = iorder[uVar12 - 1];
        uVar11 = uVar12;
      }
      t[uVar11 - 1] = dVar1;
      iorder[uVar11 - 1] = iVar3;
    }
    uVar8 = *n;
  }
  if (1 < (int)uVar8) {
    dVar2 = *t;
    iVar3 = *iorder;
    dVar1 = t[(ulong)uVar8 - 1];
    iVar4 = iorder[(ulong)uVar8 - 1];
    uVar9 = 1;
    while( true ) {
      uVar6 = uVar9 * 2;
      if ((int)uVar8 <= (int)uVar6) break;
      uVar10 = uVar6 | 1;
      if (t[(long)(int)uVar6 + -1] < t[(long)(int)(uVar6 | 1) + -1] ||
          t[(long)(int)uVar6 + -1] == t[(long)(int)(uVar6 | 1) + -1]) {
        uVar10 = uVar6;
      }
      if (dVar1 <= t[(long)(int)uVar10 + -1]) break;
      t[(long)(int)uVar9 + -1] = t[(long)(int)uVar10 + -1];
      iorder[(long)(int)uVar9 + -1] = iorder[(long)(int)uVar10 + -1];
      uVar8 = *n;
      uVar9 = uVar10;
    }
    t[(long)(int)uVar9 + -1] = dVar1;
    iorder[(long)(int)uVar9 + -1] = iVar4;
    iVar5 = *n;
    t[(long)iVar5 + -1] = dVar2;
    iorder[(long)iVar5 + -1] = iVar3;
  }
  return 0;
}

Assistant:

int hpsolb_(integer *n, doublereal *t, integer *iorder, 
	integer *iheap)
{
    /* System generated locals */
    integer i__1;

    /* Local variables */
    static integer i__, j, k;
    static doublereal out, ddum;
    static integer indxin, indxou;

/*     ************ */

/*     Subroutine hpsolb */

/*     This subroutine sorts out the least element of t, and puts the */
/*       remaining elements of t in a heap. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the arrays t and iorder. */
/*       On exit n is unchanged. */

/*     t is a double precision array of dimension n. */
/*       On entry t stores the elements to be sorted, */
/*       On exit t(n) stores the least elements of t, and t(1) to t(n-1) */
/*         stores the remaining elements in the form of a heap. */

/*     iorder is an integer array of dimension n. */
/*       On entry iorder(i) is the index of t(i). */
/*       On exit iorder(i) is still the index of t(i), but iorder may be */
/*         permuted in accordance with t. */

/*     iheap is an integer variable specifying the task. */
/*       On entry iheap should be set as follows: */
/*         iheap .eq. 0 if t(1) to t(n) is not in the form of a heap, */
/*         iheap .ne. 0 if otherwise. */
/*       On exit iheap is unchanged. */


/*     References: */
/*       Algorithm 232 of CACM (J. W. J. Williams): HEAPSORT. */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */

/*     ************ */
    /* Parameter adjustments */
    --iorder;
    --t;

    /* Function Body */
    if (*iheap == 0) {
/*        Rearrange the elements t(1) to t(n) to form a heap. */
	i__1 = *n;
	for (k = 2; k <= i__1; ++k) {
	    ddum = t[k];
	    indxin = iorder[k];
/*           Add ddum to the heap. */
	    i__ = k;
L10:
	    if (i__ > 1) {
		j = i__ / 2;
		if (ddum < t[j]) {
		    t[i__] = t[j];
		    iorder[i__] = iorder[j];
		    i__ = j;
		    goto L10;
		}
	    }
	    t[i__] = ddum;
	    iorder[i__] = indxin;
/* L20: */
	}
    }
/*     Assign to 'out' the value of t(1), the least member of the heap, */
/*        and rearrange the remaining members to form a heap as */
/*        elements 1 to n-1 of t. */
    if (*n > 1) {
	i__ = 1;
	out = t[1];
	indxou = iorder[1];
	ddum = t[*n];
	indxin = iorder[*n];
/*        Restore the heap */
L30:
	j = i__ + i__;
	if (j <= *n - 1) {
	    if (t[j + 1] < t[j]) {
		++j;
	    }
	    if (t[j] < ddum) {
		t[i__] = t[j];
		iorder[i__] = iorder[j];
		i__ = j;
		goto L30;
	    }
	}
	t[i__] = ddum;
	iorder[i__] = indxin;
/*     Put the least member in t(n). */
	t[*n] = out;
	iorder[*n] = indxou;
    }
    return 0;
}